

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r6p_2lin.cpp
# Opt level: O0

int R6P2Lin(MatrixXd *X,MatrixXd *u,int direction,double r0,RSDoublelinCameraPoseVector *results)

{
  double dVar1;
  CoeffReturnType pdVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_RCX;
  int in_EDX;
  double in_XMM0_Qa;
  Vector3d wr;
  Vector3d vr;
  int i_1;
  Vector3d Cres;
  VectorXd Ct;
  MatrixXd A;
  VectorXd x;
  vector<double,_std::allocator<double>_> w3;
  vector<double,_std::allocator<double>_> w2;
  vector<double,_std::allocator<double>_> w1;
  vector<double,_std::allocator<double>_> v3;
  vector<double,_std::allocator<double>_> v2;
  vector<double,_std::allocator<double>_> v1;
  VectorXd p;
  MatrixXd g;
  MatrixXd Helimtr;
  list<int,_std::allocator<int>_> b;
  MatrixXd Helim;
  int i;
  bool planar;
  double c0;
  double c;
  double r;
  double X_3;
  double X_2;
  double X_1;
  MatrixXd H;
  vector<double,_std::allocator<double>_> *in_stack_00011758;
  vector<double,_std::allocator<double>_> *in_stack_00011760;
  vector<double,_std::allocator<double>_> *in_stack_00011768;
  vector<double,_std::allocator<double>_> *in_stack_00011770;
  vector<double,_std::allocator<double>_> *in_stack_00011778;
  double *in_stack_00011780;
  vector<double,_std::allocator<double>_> *in_stack_00011790;
  Stride<0,_0> *in_stack_fffffffffffff378;
  value_type *__x;
  Stride<0,_0> *in_stack_fffffffffffff380;
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  *in_stack_fffffffffffff388;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  *in_stack_fffffffffffff390;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff398;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffff3a0;
  undefined8 in_stack_fffffffffffff3a8;
  Index in_stack_fffffffffffff3b0;
  Index in_stack_fffffffffffff3b8;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff3c0;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  *in_stack_fffffffffffff588;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  *in_stack_fffffffffffff590;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> local_838;
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> local_808 [24];
  undefined8 local_7f0;
  undefined8 local_7e8;
  undefined8 local_748;
  double local_740;
  double local_738;
  double local_730;
  double local_728;
  double local_720;
  double local_718;
  double local_710;
  double local_708;
  double local_700;
  int local_6d4;
  undefined4 local_6b4;
  undefined4 local_650;
  undefined4 local_64c;
  undefined1 local_5a8 [120];
  vector<double,_std::allocator<double>_> local_530 [2];
  non_const_type local_4f0;
  non_const_type local_4b8;
  double local_498;
  double local_490;
  double local_488;
  double local_480;
  double local_478;
  double local_470;
  double local_468;
  double local_460;
  undefined8 local_458;
  undefined8 local_450;
  double local_448;
  double local_440;
  double local_438;
  double local_430;
  double local_428;
  double local_420;
  undefined8 local_418;
  double local_410;
  double local_408;
  undefined8 local_400;
  double local_3f8;
  double local_398;
  double local_390;
  double local_388;
  double local_380;
  double local_378;
  double local_370;
  double local_368;
  double local_360;
  double local_358;
  double local_350;
  double local_348;
  double local_340;
  double local_338;
  undefined8 local_330;
  undefined8 local_328;
  double local_320;
  double local_318;
  double local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  double local_298;
  double local_290;
  double local_288;
  double local_280;
  double local_278;
  double local_270;
  double local_268;
  double local_260;
  double local_258;
  double local_250;
  undefined8 local_248;
  double local_240;
  undefined8 local_238;
  double local_230;
  double local_228;
  double local_220;
  double local_218;
  undefined8 local_210;
  double local_208;
  double local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  undefined8 local_128;
  undefined8 local_120;
  double local_118;
  double local_110;
  double local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  int local_80;
  undefined1 local_79;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined4 local_48;
  undefined4 local_44;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_28;
  double local_20;
  int local_14;
  
  local_44 = 0xc;
  local_48 = 0x16;
  local_28 = in_RCX;
  local_20 = in_XMM0_Qa;
  local_14 = in_EDX;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            (in_stack_fffffffffffff3a0,(int *)in_stack_fffffffffffff398,
             (int *)in_stack_fffffffffffff390);
  local_79 = 0;
  if (local_14 != 0) {
    local_78 = local_20;
  }
  for (local_80 = 0; local_80 < 6; local_80 = local_80 + 1) {
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    local_50 = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    local_58 = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    local_60 = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    local_68 = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                        in_stack_fffffffffffff380,(Index)in_stack_fffffffffffff378);
    local_70 = *pdVar2;
    if (local_14 == 0) {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff390,
                 (Index)in_stack_fffffffffffff388);
      local_f0 = 0;
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
      operator<<(in_stack_fffffffffffff388,(Scalar *)in_stack_fffffffffffff380);
      local_f8 = 0xbff0000000000000;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_100 = 0;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_108 = local_20 - local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_110 = local_70 * local_68 - local_70 * local_20;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_118 = local_60 * local_70 * local_20 +
                  ((local_58 * local_68 - local_58 * local_20) - local_60 * local_70 * local_68);
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_120 = 0;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_128 = 0;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_130 = local_50 * local_20 - local_50 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_138 = local_60 * local_70 * local_20 - local_60 * local_70 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_140 = local_60 * local_20 - local_60 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_148 = local_50 * local_70 * local_68 - local_50 * local_70 * local_20;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_150 = local_58 * local_70 * local_68 - local_58 * local_70 * local_20;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_158 = local_58 * local_68 - local_58 * local_20;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_160 = local_58 * local_70 + local_60;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_168 = -local_50 * local_70;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_170 = -local_50;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_178 = (local_58 * local_70 * local_68 + (local_60 * local_68 - local_60 * local_20)) -
                  local_58 * local_70 * local_20;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_180 = local_50 * local_70 * local_20 - local_50 * local_70 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_188 = local_50 * local_20 - local_50 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_190 = local_60 * local_70 - local_58;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::~CommaInitializer((CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                           *)0x74b93d);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff390,
                 (Index)in_stack_fffffffffffff388);
      local_1f0 = 0x3ff0000000000000;
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
      operator<<(in_stack_fffffffffffff388,(Scalar *)in_stack_fffffffffffff380);
      local_1f8 = 0;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_200 = -local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_208 = local_68 - local_20;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_210 = 0;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_218 = local_20 * local_68 - local_68 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_220 = local_60 * local_68 * local_68 - local_60 * local_20 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_228 = local_58 * local_68 - local_58 * local_20;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_230 = local_60 * local_68 - local_60 * local_20;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_238 = 0;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_240 = (local_60 * local_68 * local_68 + (local_50 * local_20 - local_50 * local_68)) -
                  local_60 * local_68 * local_20;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_248 = 0;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_250 = local_50 * local_20 * local_68 - local_50 * local_68 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_258 = local_58 * local_20 * local_68 - local_58 * local_68 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_260 = local_50 * local_20 - local_50 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_268 = -local_58 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_270 = local_50 * local_68 + local_60;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_278 = -local_58;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_280 = local_58 * local_20 * local_68 - local_58 * local_68 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_288 = (local_50 * local_68 * local_68 + (local_60 * local_68 - local_60 * local_20)) -
                  local_50 * local_68 * local_20;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_290 = local_58 * local_20 - local_58 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_298 = local_50 - local_60 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::~CommaInitializer((CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                           *)0x74bfb5);
    }
    else {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff390,
                 (Index)in_stack_fffffffffffff388);
      local_2f8 = 0;
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
      operator<<(in_stack_fffffffffffff388,(Scalar *)in_stack_fffffffffffff380);
      local_300 = 0xbff0000000000000;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_308 = 0;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_310 = local_78 - local_70;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_318 = local_70 * local_70 - local_78 * local_70;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_320 = local_60 * local_70 * local_78 +
                  ((local_58 * local_70 - local_58 * local_78) - local_60 * local_70 * local_70);
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_328 = 0;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_330 = 0;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_338 = local_50 * local_78 - local_50 * local_70;
      in_stack_fffffffffffff590 =
           Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
           operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_340 = local_60 * local_78 * local_70 - local_60 * local_70 * local_70;
      in_stack_fffffffffffff588 =
           Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
           operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_348 = local_60 * local_78 - local_60 * local_70;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_350 = local_50 * local_70 * local_70 - local_50 * local_78 * local_70;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_358 = local_58 * local_70 * local_70 - local_58 * local_78 * local_70;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_360 = local_58 * local_70 - local_58 * local_78;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_368 = local_58 * local_70 + local_60;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_370 = -local_50 * local_70;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_378 = -local_50;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_380 = (local_58 * local_70 * local_70 + (local_60 * local_70 - local_60 * local_78)) -
                  local_58 * local_70 * local_78;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_388 = local_50 * local_78 * local_70 - local_50 * local_70 * local_70;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_390 = local_50 * local_78 - local_50 * local_70;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_398 = local_60 * local_70 - local_58;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::~CommaInitializer((CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                           *)0x74c676);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff390,
                 (Index)in_stack_fffffffffffff388);
      local_3f8 = -local_70;
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
      operator<<(in_stack_fffffffffffff388,(Scalar *)in_stack_fffffffffffff380);
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_400 = 0;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_408 = local_78 * local_70 - local_70 * local_70;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_410 = local_70 * local_68 - local_78 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_418 = 0;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_420 = local_58 * local_78 * local_68 - local_58 * local_70 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_428 = local_58 * local_78 * local_70 - local_58 * local_70 * local_70;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_430 = local_60 * local_78 * local_70 - local_60 * local_70 * local_70;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_438 = local_50 * local_70 * local_68 - local_50 * local_78 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_440 = local_50 * local_70 * local_70 - local_50 * local_78 * local_70;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_448 = local_60 * local_70 * local_68 - local_60 * local_78 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_450 = 0;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_458 = 0;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_460 = local_58 * local_78 * local_68 +
                  ((local_50 * local_70 * local_70 - local_50 * local_70 * local_78) -
                  local_58 * local_70 * local_68);
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_468 = -local_60 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_470 = -local_60 * local_70;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_478 = local_58 * local_70 + local_50 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_480 = local_60 * local_78 * local_68 - local_60 * local_70 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_488 = local_60 * local_78 * local_70 - local_60 * local_70 * local_70;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_490 = (local_50 * local_70 * local_68 +
                  (local_58 * local_70 * local_70 - local_58 * local_70 * local_78)) -
                  local_50 * local_78 * local_68;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      local_498 = local_58 * local_68 - local_50 * local_70;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::~CommaInitializer((CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                           *)0x74cd7a);
    }
  }
  local_4b8 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_fffffffffffff378);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff380,
             (EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             in_stack_fffffffffffff378);
  std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)0x74ce33);
  colEchelonForm((MatrixXd *)in_stack_fffffffffffff590,
                 (list<int,_std::allocator<int>_> *)in_stack_fffffffffffff588);
  local_4f0 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         in_stack_fffffffffffff378);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff380,
             (EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             in_stack_fffffffffffff378);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x74ce95);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x74cea4);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x74ceb3);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x74cec0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x74cecd);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x74ceda);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x74cee7);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x74cef4);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            (in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b0,
             (int)((ulong)in_stack_fffffffffffff3a8 >> 0x20),(int)in_stack_fffffffffffff3a8);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
  transpose((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
            in_stack_fffffffffffff380);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff380,
             (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
              *)in_stack_fffffffffffff378);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::data
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x74cf5c);
  Eigen::Stride<0,_0>::Stride(in_stack_fffffffffffff380);
  Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffff390,(PointerArgType)in_stack_fffffffffffff388,
             (Index)in_stack_fffffffffffff380,in_stack_fffffffffffff378);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff380,
             (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffff378);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x74cfbd);
  __x = (value_type *)local_5a8;
  solveVW3var(in_stack_00011780,in_stack_00011778,in_stack_00011770,in_stack_00011768,
              in_stack_00011760,in_stack_00011758,in_stack_00011790);
  local_64c = 0x10;
  local_650 = 1;
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<int,int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff3a0,
             (int *)in_stack_fffffffffffff398,(int *)in_stack_fffffffffffff390);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            (in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b0,
             (int)((ulong)in_stack_fffffffffffff3a8 >> 0x20),(int)in_stack_fffffffffffff3a8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff380,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             __x);
  local_6b4 = 6;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff390,
             (int *)in_stack_fffffffffffff388);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x74d0b3);
  local_6d4 = 0;
  while( true ) {
    uVar3 = (ulong)local_6d4;
    sVar4 = std::vector<double,_std::allocator<double>_>::size(local_530);
    if (sVar4 <= uVar3) break;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_530,(long)local_6d4);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x30),
                        (long)local_6d4);
    local_700 = dVar1 * *pvVar5;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff388,
               (Scalar *)in_stack_fffffffffffff380);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_530,(long)local_6d4);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x18),
                        (long)local_6d4);
    local_708 = dVar1 * *pvVar5;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_530,(long)local_6d4);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_5a8,(long)local_6d4);
    local_710 = dVar1 * *pvVar5;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x60),
                        (long)local_6d4);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x30),
                        (long)local_6d4);
    local_718 = dVar1 * *pvVar5;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x60),
                        (long)local_6d4);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x18),
                        (long)local_6d4);
    local_720 = dVar1 * *pvVar5;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x60),
                        (long)local_6d4);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_5a8,(long)local_6d4);
    local_728 = dVar1 * *pvVar5;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x48),
                        (long)local_6d4);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x30),
                        (long)local_6d4);
    local_730 = dVar1 * *pvVar5;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x48),
                        (long)local_6d4);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x18),
                        (long)local_6d4);
    local_738 = dVar1 * *pvVar5;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x48),
                        (long)local_6d4);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_5a8,(long)local_6d4);
    local_740 = dVar1 * *pvVar5;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
    std::vector<double,_std::allocator<double>_>::operator[](local_530,(long)local_6d4);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x60),(long)local_6d4);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x48),(long)local_6d4);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x30),(long)local_6d4);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x18),(long)local_6d4);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)local_5a8,(long)local_6d4);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
    local_748 = 0x3ff0000000000000;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x74d5fb);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator-
              (in_stack_fffffffffffff398);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>>
    ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)in_stack_fffffffffffff398,
                (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff390);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff380,
               (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)__x);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x74d655);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x74d664);
    std::vector<double,_std::allocator<double>_>::operator[](local_530,(long)local_6d4);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff388,
               (Scalar *)in_stack_fffffffffffff380);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x60),(long)local_6d4);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff390,
               (Scalar *)in_stack_fffffffffffff388);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x48),(long)local_6d4);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff390,
               (Scalar *)in_stack_fffffffffffff388);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer
              ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x74d6f2);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x30),(long)local_6d4);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff388,
               (Scalar *)in_stack_fffffffffffff380);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(local_5a8 + 0x18),(long)local_6d4);
    this = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                      in_stack_fffffffffffff390,(Scalar *)in_stack_fffffffffffff388);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)local_5a8,(long)local_6d4);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff390,
               (Scalar *)in_stack_fffffffffffff388);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer
              ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x74d77e);
    in_stack_fffffffffffff398 = local_28;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff380,&__x->v);
    in_stack_fffffffffffff390 = &local_838;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,
               (Index)in_stack_fffffffffffff398,(int)((ulong)in_stack_fffffffffffff390 >> 0x20));
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff380,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)__x
              );
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff380,&__x->v);
    in_stack_fffffffffffff388 = local_808;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,
               (Index)in_stack_fffffffffffff398,(int)((ulong)in_stack_fffffffffffff390 >> 0x20));
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff380,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)__x
              );
    local_7f0 = 0x3ff0000000000000;
    local_7e8 = 0;
    std::vector<RSDoublelinCameraPose,_std::allocator<RSDoublelinCameraPose>_>::push_back
              ((vector<RSDoublelinCameraPose,_std::allocator<RSDoublelinCameraPose>_> *)
               in_stack_fffffffffffff380,__x);
    local_6d4 = local_6d4 + 1;
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x74d9b4);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x74d9c1);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x74d9ce);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff390);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff390);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff390);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff390);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff390);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff390);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x74da29);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x74da36);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x74da43);
  std::__cxx11::list<int,_std::allocator<int>_>::~list((list<int,_std::allocator<int>_> *)0x74da50);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x74da5d);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x74da6a);
  return 0;
}

Assistant:

int R6P2Lin(const Eigen::MatrixXd & X, const Eigen::MatrixXd & u, int direction, double r0, RSDoublelinCameraPoseVector * results){
	Eigen::MatrixXd H(12, 22);
	double X_1, X_2, X_3, r, c, c0;
	bool planar = false;
	if (direction!=0){
		c0 = r0;
	}
	

	for (int i = 0; i < 6; i++)
	{
		X_1 = X(i * 3);
		X_2 = X(i * 3 + 1);
		X_3 = X(i * 3 + 2);
		r = u(i * 2);
		c = u(i * 2 + 1);

		if (direction == 0){
			H.row(i * 2) << 0, -1, c, 0, r0 - r, c*r - c*r0, X_2*r - X_2*r0 - X_3*c*r + X_3*c*r0, 0, 0, X_1*r0 - X_1*r, X_3*c*r0 - X_3*c*r, X_3*r0 - X_3*r, X_1*c*r - X_1*c*r0, X_2*c*r - X_2*c*r0, X_2*r - X_2*r0, X_3 + X_2*c, -X_1*c, -X_1, X_3*r - X_3*r0 + X_2*c*r - X_2*c*r0, X_1*c*r0 - X_1*c*r, X_1*r0 - X_1*r, X_3*c - X_2;
			H.row(i * 2 + 1) << 1, 0, -r, r - r0, 0, -r*r + r0*r, X_3*r*r - X_3*r0*r, X_2*r - X_2*r0, X_3*r - X_3*r0, 0, X_1*r0 - X_1*r + X_3*r*r - X_3*r*r0, 0, -X_1*r*r + X_1*r0*r, -X_2*r*r + X_2*r0*r, X_1*r0 - X_1*r, -X_2*r, X_3 + X_1*r, -X_2, -X_2*r*r + X_2*r0*r, X_3*r - X_3*r0 + X_1*r*r - X_1*r*r0, X_2*r0 - X_2*r, X_1 - X_3*r;
		}
		else{
			H.row(i * 2) << 0, -1, c, 0, c0 - c, c*c - c0*c, X_2*c - X_2*c0 - X_3*c*c + X_3*c*c0, 0, 0, X_1*c0 - X_1*c, -X_3*c*c + X_3*c0*c, X_3*c0 - X_3*c, X_1*c*c - X_1*c0*c, X_2*c*c - X_2*c0*c, X_2*c - X_2*c0, X_3 + X_2*c, -X_1*c, -X_1, X_3*c - X_3*c0 + X_2*c*c - X_2*c*c0, -X_1*c*c + X_1*c0*c, X_1*c0 - X_1*c, X_3*c - X_2;
			H.row(i * 2 + 1) << -c, r, 0, -c*c + c0*c, c*r - c0*r, 0, X_2*c0*r - X_2*c*r, -X_2*c*c + X_2*c0*c, -X_3*c*c+ X_3*c0*c, X_1*c*r - X_1*c0*r, X_1*c*c - X_1*c0*c, X_3*c*r - X_3*c0*r, 0, 0, X_1*c*c - X_1*c*c0 - X_2*c*r + X_2*c0*r, -X_3*r, -X_3*c, X_2*c + X_1*r, X_3*c0*r - X_3*c*r, -X_3*c*c + X_3*c0*c, X_2*c*c - X_2*c*c0 + X_1*c*r - X_1*c0*r, X_2*r - X_1*c;
		}
	}
	
	Eigen::MatrixXd Helim = H.transpose();
	std::list<int> b;
	colEchelonForm(Helim, b);

	Eigen::MatrixXd Helimtr = Helim.transpose();
	
	Eigen::MatrixXd g; 
	Eigen::VectorXd p;
	std::vector<double> v1, v2, v3, w1, w2, w3;
	
    g = Helimtr.block(6, 12, 6, 10).transpose();
    p = Eigen::Map<Eigen::VectorXd>(g.data(), 6 * 10);
    solveVW3var(p.data(), v1, v2, v3, w1, w2, w3);
	
	Eigen::VectorXd x(16,1);
	Eigen::MatrixXd A = Helimtr.block(0,6,6,16);
	Eigen::VectorXd Ct(6);
	Eigen::Vector3d Cres;

	for (int i = 0; i < v1.size(); i++)
	{
		x << v1[i]*w1[i], v1[i]*w2[i], v1[i]*w3[i], v2[i]*w1[i], v2[i]*w2[i], v2[i]*w3[i], v3[i]*w1[i], v3[i]*w2[i], v3[i]*w3[i], v1[i], v2[i], v3[i], w1[i], w2[i], w3[i], 1;
		Ct = -A*x;
		Eigen::Vector3d vr, wr;
		vr << v1[i], v2[i], v3[i];
		wr << w1[i], w2[i], w3[i];
		results->push_back({vr, Ct.segment(0, 3), wr, Ct.segment(3, 3), 1, 0});
	}

    return 0;
}